

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

Pattern * __thiscall CombinePattern::doAnd(CombinePattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  Pattern *pPVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*b->_vptr_Pattern[8])(b);
  if (iVar1 != 0) {
    iVar1 = (*b->_vptr_Pattern[5])(b,this,(ulong)(uint)-sa);
    return (Pattern *)CONCAT44(extraout_var,iVar1);
  }
  lVar3 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  if (lVar3 == 0) {
    lVar3 = __dynamic_cast(b,&Pattern::typeinfo,&InstructionPattern::typeinfo,0);
    if (lVar3 != 0) {
      iVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                        (this->instr,lVar3,(ulong)(uint)sa);
      pPVar6 = (Pattern *)operator_new(0x18);
      iVar2 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
      pPVar6->_vptr_Pattern = (_func_int **)&PTR__CombinePattern_003ce1d8;
      pPVar6[1]._vptr_Pattern = (_func_int **)CONCAT44(extraout_var_03,iVar2);
      pPVar6[2]._vptr_Pattern = (_func_int **)CONCAT44(extraout_var_02,iVar1);
      return pPVar6;
    }
    iVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                      (this->context,b,0);
    pp_Var4 = (_func_int **)CONCAT44(extraout_var_04,iVar1);
    iVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
    pp_Var5 = (_func_int **)CONCAT44(extraout_var_05,iVar1);
    if (sa < 0) {
      (**(code **)(*pp_Var5 + 0x18))(pp_Var5,-sa);
    }
  }
  else {
    iVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                      (this->context,*(undefined8 *)(lVar3 + 8),0);
    pp_Var4 = (_func_int **)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[5])
                      (this->instr,*(undefined8 *)(lVar3 + 0x10),(ulong)(uint)sa);
    pp_Var5 = (_func_int **)CONCAT44(extraout_var_01,iVar1);
  }
  pPVar6 = (Pattern *)operator_new(0x18);
  pPVar6->_vptr_Pattern = (_func_int **)&PTR__CombinePattern_003ce1d8;
  pPVar6[1]._vptr_Pattern = pp_Var4;
  pPVar6[2]._vptr_Pattern = pp_Var5;
  return pPVar6;
}

Assistant:

Pattern *CombinePattern::doAnd(const Pattern *b,int4 sa) const

{
  CombinePattern *tmp;
  
  if (b->numDisjoint() != 0)
    return b->doAnd(this,-sa);

  const CombinePattern *b2 = dynamic_cast<const CombinePattern *>(b);
  if (b2 != (CombinePattern *)0) {
    ContextPattern *c = (ContextPattern *)context->doAnd(b2->context,0);
    InstructionPattern *i = (InstructionPattern *)instr->doAnd(b2->instr,sa);
    tmp = new CombinePattern(c,i);
  }
  else {
    const InstructionPattern *b3 = dynamic_cast<const InstructionPattern *>(b);
    if (b3 != (const InstructionPattern *)0) {
      InstructionPattern *i = (InstructionPattern *)instr->doAnd(b3,sa);
      tmp = new CombinePattern((ContextPattern *)context->simplifyClone(),i);
    }
    else {			// Must be a ContextPattern
      ContextPattern *c = (ContextPattern *)context->doAnd(b,0);
      InstructionPattern *newpat = (InstructionPattern *) instr->simplifyClone();
      if (sa < 0)
	newpat->shiftInstruction(-sa);
      tmp = new CombinePattern(c,newpat);
    }
  }
  return tmp;
}